

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int set_sort(lyxp_set *set)

{
  ulong uVar1;
  undefined8 *puVar2;
  lyd_node_inner *plVar3;
  lyd_node_inner *plVar4;
  lyd_node *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  LY_ERR LVar10;
  uint uVar11;
  int iVar12;
  uint32_t uVar13;
  lyxp_set_node *plVar14;
  lyd_node_inner *plVar15;
  uint uVar16;
  ulong uVar17;
  lyxp_set_node *item1;
  long lVar18;
  long lVar19;
  lyxp_set_hash_node hnode;
  lyxp_set_node item;
  
  iVar12 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (1 < set->used)) {
    plVar15 = (lyd_node_inner *)set->tree;
    do {
      plVar3 = (plVar15->field_0).node.parent;
      plVar4 = plVar15;
      plVar15 = plVar3;
    } while (plVar3 != (lyd_node_inner *)0x0);
    do {
      plVar15 = plVar4;
      plVar4 = (lyd_node_inner *)(plVar15->field_0).node.prev;
    } while ((plVar4->field_0).node.next != (lyd_node *)0x0);
    LVar10 = set_assign_pos(set,(lyd_node *)plVar15,set->root_type);
    if (LVar10 == LY_SUCCESS) {
      ly_log_dbg(2,"SORT BEGIN");
      print_set_debug(set);
      uVar16 = 0;
      uVar11 = set->used;
      do {
        if (uVar11 <= uVar16) break;
        lVar18 = 0x10;
        lVar19 = 1;
        bVar8 = false;
        bVar9 = false;
        uVar17 = 0;
        while (uVar1 = uVar17 + 1, uVar1 < uVar11 - uVar16) {
          item1 = (lyxp_set_node *)((long)&(set->val).nodes[-1].node + lVar18);
          plVar14 = (lyxp_set_node *)((long)&((set->val).nodes)->node + lVar18);
          if (bVar8) {
            iVar12 = set_sort_compare(plVar14,item1);
            if (-1 < iVar12) goto LAB_0019dd40;
LAB_0019dd07:
            plVar14 = (set->val).nodes;
            plVar5 = plVar14[uVar17].node;
            uVar6 = *(undefined8 *)&plVar14[uVar17].type;
            puVar2 = (undefined8 *)((long)&plVar14->node + lVar18);
            uVar7 = puVar2[1];
            plVar14 = plVar14 + uVar17;
            plVar14->node = (lyd_node *)*puVar2;
            plVar14->type = (int)uVar7;
            plVar14->pos = (int)((ulong)uVar7 >> 0x20);
            puVar2 = (undefined8 *)((long)&((set->val).nodes)->node + lVar18);
            *puVar2 = plVar5;
            puVar2[1] = uVar6;
            bVar9 = true;
          }
          else {
            iVar12 = set_sort_compare(item1,plVar14);
            if (0 < iVar12) {
              uVar17 = lVar19 - 1;
              goto LAB_0019dd07;
            }
LAB_0019dd40:
            bVar8 = !bVar8;
          }
          lVar19 = lVar19 + 1;
          lVar18 = lVar18 + 0x10;
          uVar17 = uVar1;
          uVar11 = set->used;
        }
        uVar16 = uVar16 + 1;
      } while (bVar9);
      ly_log_dbg(2,"SORT END %d");
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (ly_ht *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x720,"int set_sort(struct lyxp_set *)");
        }
        uVar17 = 0xffffffffffffffff;
        lVar18 = 8;
        while (uVar17 = uVar17 + 1, uVar17 < set->used) {
          hnode.node = *(lyd_node **)((long)(set->val).nodes + lVar18 + -8);
          hnode.type = *(lyxp_node_type *)((long)&((set->val).nodes)->node + lVar18);
          uVar13 = lyht_hash_multi(0,(char *)&hnode,8);
          uVar13 = lyht_hash_multi(uVar13,(char *)&hnode.type,4);
          uVar13 = lyht_hash_multi(uVar13,(char *)0x0,0);
          LVar10 = lyht_find(set->ht,&hnode,uVar13,(void **)0x0);
          lVar18 = lVar18 + 0x10;
          if (LVar10 != LY_SUCCESS) {
            __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x729,"int set_sort(struct lyxp_set *)");
          }
        }
      }
      iVar12 = uVar16 - 1;
    }
    else {
      iVar12 = -1;
    }
  }
  return iVar12;
}

Assistant:

static int
set_sort(struct lyxp_set *set)
{
    uint32_t i, j;
    int ret = 0, cmp;
    ly_bool inverted, change;
    const struct lyd_node *root;
    struct lyxp_set_node item;
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used < 2)) {
        return 0;
    }

    /* find first top-level node to be used as anchor for positions */
    for (root = set->tree; root->parent; root = lyd_parent(root)) {}
    for ( ; root->prev->next; root = root->prev) {}

    /* fill positions */
    if (set_assign_pos(set, root, set->root_type)) {
        return -1;
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);
#endif

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1]);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j]);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);
#endif

    /* check node hashes */
    if (set->used >= LYD_HT_MIN_ITEMS) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = lyht_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }

    return ret - 1;
}